

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNotationImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMNotationImpl::setSystemId(DOMNotationImpl *this,XMLCh *arg)

{
  int iVar1;
  undefined4 extraout_var;
  XMLCh *pXVar2;
  DOMException *this_00;
  undefined4 extraout_var_00;
  undefined8 *puVar3;
  undefined4 extraout_var_01;
  
  if (((this->fNode).flags & 1) == 0) {
    iVar1 = (*(this->super_DOMNotation).super_DOMNode._vptr_DOMNode[0xc])(this);
    pXVar2 = (XMLCh *)(**(code **)(*(long *)(CONCAT44(extraout_var,iVar1) + -8) + 0x38))
                                (CONCAT44(extraout_var,iVar1) + -8,arg);
    this->fSystemId = pXVar2;
    return;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  iVar1 = (*(this->super_DOMNotation).super_DOMNode._vptr_DOMNode[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar1) == 0) {
    puVar3 = &XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar1 = (*(this->super_DOMNotation).super_DOMNode._vptr_DOMNode[0xc])(this);
    puVar3 = (undefined8 *)(CONCAT44(extraout_var_01,iVar1) + 0x158);
  }
  DOMException::DOMException(this_00,7,0,(MemoryManager *)*puVar3);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMNotationImpl::setSystemId(const XMLCh *arg)
{
    if(fNode.isReadOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR,0, GetDOMNodeMemoryManager);

    fSystemId = ((DOMDocumentImpl *)getOwnerDocument())->cloneString(arg);
}